

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::H1V2Convert(jpeg_decoder *this)

{
  byte bVar1;
  uint8 *puVar2;
  uint8 *puVar3;
  uint8 *puVar4;
  int j;
  long lVar5;
  long lVar6;
  uint8 *puVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  lVar6 = (long)this->m_max_mcu_y_size - (long)this->m_mcu_lines_left;
  puVar2 = this->m_pScan_line_0;
  uVar9 = (uint)lVar6;
  lVar5 = (ulong)(uVar9 & 7) * 8 + 0x40;
  if ((int)uVar9 < 8) {
    lVar5 = lVar6 * 8;
  }
  puVar3 = this->m_pSample_buf + lVar5;
  puVar4 = this->m_pScan_line_1;
  puVar7 = this->m_pSample_buf + (long)(int)(uVar9 * 4 & 0xfffffff8) + 0x80;
  for (iVar8 = this->m_max_mcus_per_row; 0 < iVar8; iVar8 = iVar8 + -1) {
    lVar6 = 0;
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      iVar11 = this->m_crr[puVar7[lVar5 + 0x40]];
      uVar9 = (uint)puVar3[lVar5];
      iVar10 = iVar11 + uVar9;
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      iVar12 = this->m_cbg[puVar7[lVar5]] + this->m_crg[puVar7[lVar5 + 0x40]] >> 0x10;
      iVar13 = this->m_cbb[puVar7[lVar5]];
      puVar2[lVar5 * 4] = (uint8)iVar10;
      iVar10 = uVar9 + iVar12;
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      puVar2[lVar5 * 4 + 1] = (uint8)iVar10;
      iVar10 = uVar9 + iVar13;
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      puVar2[lVar5 * 4 + 2] = (uint8)iVar10;
      puVar2[lVar5 * 4 + 3] = 0xff;
      bVar1 = puVar3[lVar5 + 8];
      iVar11 = iVar11 + (uint)bVar1;
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      puVar4[lVar5 * 4] = (uint8)iVar11;
      iVar12 = iVar12 + (uint)bVar1;
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      if (0xfe < iVar12) {
        iVar12 = 0xff;
      }
      puVar4[lVar5 * 4 + 1] = (uint8)iVar12;
      iVar13 = iVar13 + (uint)bVar1;
      iVar10 = 0;
      if (0 < iVar13) {
        iVar10 = iVar13;
      }
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      puVar4[lVar5 * 4 + 2] = (uint8)iVar10;
      puVar4[lVar5 * 4 + 3] = 0xff;
      lVar6 = lVar6 + -4;
    }
    puVar3 = puVar3 + 0x100;
    puVar7 = puVar7 + 0x100;
    puVar4 = puVar4 + -lVar6;
    puVar2 = puVar2 + -lVar6;
  }
  return;
}

Assistant:

void jpeg_decoder::H1V2Convert()
	{
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d0 = m_pScan_line_0;
		uint8* d1 = m_pScan_line_1;
		uint8* y;
		uint8* c;

		if (row < 8)
			y = m_pSample_buf + row * 8;
		else
			y = m_pSample_buf + 64 * 1 + (row & 7) * 8;

		c = m_pSample_buf + 64 * 2 + (row >> 1) * 8;

		for (int i = m_max_mcus_per_row; i > 0; i--)
		{
			for (int j = 0; j < 8; j++)
			{
				int cb = c[0 + j];
				int cr = c[64 + j];

				int rc = m_crr[cr];
				int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
				int bc = m_cbb[cb];

				int yy = y[j];
				d0[0] = clamp(yy + rc);
				d0[1] = clamp(yy + gc);
				d0[2] = clamp(yy + bc);
				d0[3] = 255;

				yy = y[8 + j];
				d1[0] = clamp(yy + rc);
				d1[1] = clamp(yy + gc);
				d1[2] = clamp(yy + bc);
				d1[3] = 255;

				d0 += 4;
				d1 += 4;
			}

			y += 64 * 4;
			c += 64 * 4;
		}
	}